

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml.c
# Opt level: O3

PyObject * libxml_xmlCreatePushParser(PyObject *self,PyObject *args)

{
  int iVar1;
  xmlParserCtxtPtr ctxt;
  PyObject *pPVar2;
  xmlSAXHandler *pxVar3;
  int size;
  PyObject *pyobj_SAX;
  char *URI;
  char *chunk;
  undefined4 local_24;
  long *local_20;
  undefined8 local_18;
  undefined8 local_10;
  
  local_20 = (long *)0x0;
  pPVar2 = (PyObject *)0x0;
  iVar1 = _PyArg_ParseTuple_SizeT
                    (args,"Oziz:xmlCreatePushParser",&local_20,&local_10,&local_24,&local_18);
  if (iVar1 != 0) {
    if (local_20 == (long *)&_Py_NoneStruct) {
      pxVar3 = (xmlSAXHandler *)0x0;
    }
    else {
      *local_20 = *local_20 + 1;
      pxVar3 = &pythonSaxHandler;
    }
    ctxt = (xmlParserCtxtPtr)xmlCreatePushParserCtxt(pxVar3,local_20,local_10,local_24,local_18);
    pPVar2 = libxml_xmlParserCtxtPtrWrap(ctxt);
  }
  return pPVar2;
}

Assistant:

PyObject *
libxml_xmlCreatePushParser(ATTRIBUTE_UNUSED PyObject * self,
                           PyObject * args)
{
    const char *chunk;
    int size;
    const char *URI;
    PyObject *pyobj_SAX = NULL;
    xmlSAXHandlerPtr SAX = NULL;
    xmlParserCtxtPtr ret;
    PyObject *pyret;

    if (!PyArg_ParseTuple
        (args, (char *) "Oziz:xmlCreatePushParser", &pyobj_SAX, &chunk,
         &size, &URI))
        return (NULL);

    if (pyobj_SAX != Py_None) {
        SAX = &pythonSaxHandler;
        Py_INCREF(pyobj_SAX);
        /* The reference is released in pythonEndDocument() */
    }
    ret = xmlCreatePushParserCtxt(SAX, pyobj_SAX, chunk, size, URI);
    pyret = libxml_xmlParserCtxtPtrWrap(ret);
    return (pyret);
}